

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.cpp
# Opt level: O1

void __thiscall
duckdb::TableFunctionSet::TableFunctionSet(TableFunctionSet *this,TableFunction *fun)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  ulong *local_30;
  ulong local_20;
  undefined8 uStack_18;
  
  local_30 = (ulong *)(fun->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
                      name._M_dataplus._M_p;
  paVar1 = &(fun->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name.
            field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30 == paVar1) {
    local_20 = paVar1->_M_allocated_capacity;
    uStack_18 = *(undefined8 *)
                 ((long)&(fun->super_SimpleNamedParameterFunction).super_SimpleFunction.
                         super_Function.name.field_2 + 8);
    local_30 = &local_20;
  }
  else {
    local_20 = paVar1->_M_allocated_capacity;
  }
  sVar2 = (fun->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name.
          _M_string_length;
  (fun->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name._M_dataplus.
  _M_p = (pointer)paVar1;
  (fun->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name.
  _M_string_length = 0;
  (fun->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name.field_2.
  _M_local_buf[0] = '\0';
  paVar1 = &(this->super_FunctionSet<duckdb::TableFunction>).name.field_2;
  (this->super_FunctionSet<duckdb::TableFunction>).name._M_dataplus._M_p = (pointer)paVar1;
  if (local_30 == &local_20) {
    paVar1->_M_allocated_capacity = local_20;
    *(undefined8 *)((long)&(this->super_FunctionSet<duckdb::TableFunction>).name.field_2 + 8) =
         uStack_18;
  }
  else {
    (this->super_FunctionSet<duckdb::TableFunction>).name._M_dataplus._M_p = (pointer)local_30;
    (this->super_FunctionSet<duckdb::TableFunction>).name.field_2._M_allocated_capacity = local_20;
  }
  (this->super_FunctionSet<duckdb::TableFunction>).name._M_string_length = sVar2;
  local_20 = local_20 & 0xffffffffffffff00;
  (this->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&(this->super_FunctionSet<duckdb::TableFunction>).functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,fun);
  return;
}

Assistant:

TableFunctionSet::TableFunctionSet(TableFunction fun) : FunctionSet(std::move(fun.name)) {
	functions.push_back(std::move(fun));
}